

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_keytrans.cpp
# Opt level: O0

bool __thiscall Am_Input_Char::helper_check_equal(Am_Input_Char *this,Am_Input_Char i)

{
  Am_Input_Char *this_local;
  Am_Input_Char i_local;
  
  this_local._2_2_ = i._2_2_;
  if ((((*(ushort *)&this->field_0x2 >> 3 & 1) == 0) && ((this_local._2_2_ >> 3 & 1) == 0)) &&
     ((((byte)*(undefined2 *)&this->field_0x2 & 1) != (i._2_1_ & 1) ||
      ((((byte)(*(ushort *)&this->field_0x2 >> 1) & 1) != ((byte)(this_local._2_2_ >> 1) & 1) ||
       (((byte)(*(ushort *)&this->field_0x2 >> 2) & 1) != ((byte)(this_local._2_2_ >> 2) & 1)))))))
  {
    this_local._7_1_ = false;
  }
  else if ((this->code == 0x167) || (this_local._0_2_ = i.code, (short)this_local == 0x167)) {
    if (((this_local._2_2_ >> 8 & 0xf) == 0) && ((*(ushort *)&this->field_0x2 >> 8 & 0xf) == 0)) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else if (((*(ushort *)&this->field_0x2 >> 8 & 0xf) == 0) || ((this_local._2_2_ >> 8 & 0xf) == 0))
  {
    if (this->code == (short)this_local) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else if (((*(ushort *)&this->field_0x2 >> 8 & 0xf) == 7) ||
          (((this_local._2_2_ >> 8 & 0xf) == 7 ||
           ((*(ushort *)&this->field_0x2 >> 8 & 0xf) == (this_local._2_2_ >> 8 & 0xf))))) {
    if (((*(ushort *)&this->field_0x2 >> 4 & 0xf) == 3) ||
       (((this_local._2_2_ >> 4 & 0xf) == 3 ||
        ((*(ushort *)&this->field_0x2 >> 4 & 0xf) == (this_local._2_2_ >> 4 & 0xf))))) {
      if ((this->code == (short)this_local) ||
         ((this->code == 0x106 || ((short)this_local == 0x106)))) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
Am_Input_Char::helper_check_equal(Am_Input_Char i) const
{
  if (!(any_modifier || i.any_modifier ||
        (shift == i.shift && control == i.control && meta == i.meta)))
    return false; // modifiers don't match

  // now check code
  if (code == Am_ANY_KEYBOARD || i.code == Am_ANY_KEYBOARD) {
    // any_keyboard match
    if (i.click_count == Am_NOT_MOUSE && click_count == Am_NOT_MOUSE)
      return true;
    else
      return false;
  } else if (click_count == Am_NOT_MOUSE || i.click_count == Am_NOT_MOUSE) {
    // specific keyboard key
    if (code == i.code)
      return true;
    else
      return false;
    // note: ignores button up or down for keyboard keys since
    // only support down.
  } else { // here must be a mouse button
    // first, check click count
    if (!(click_count == Am_ANY_CLICK || i.click_count == Am_ANY_CLICK ||
          click_count == i.click_count))
      return false;
    // now button down, up
    if (!(button_down == Am_ANY_DOWN_UP || i.button_down == Am_ANY_DOWN_UP ||
          button_down == i.button_down))
      return false;
    //finally, check code
    if (code == i.code || code == Am_ANY_MOUSE || i.code == Am_ANY_MOUSE)
      return true;
    else
      return false;
  } // end else
}